

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>::
insert<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Entry,capnp::Text::Reader&>
          (TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks> *this,
          ArrayPtr<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry> table,size_t pos,
          Reader *params)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar5;
  ulong uVar6;
  undefined8 *in_R9;
  Maybe<unsigned_long> MVar7;
  Iterator iter;
  Iterator IStack_78;
  size_t local_60;
  size_t local_58;
  SearchKey local_50;
  Entry *local_48;
  size_t *local_40;
  
  local_60 = table.size_;
  local_48 = table.ptr;
  local_40 = &local_60;
  local_50._vptr_SearchKey = (_func_int **)&PTR_search_001c6028;
  local_58 = pos;
  _::BTreeImpl::insert
            (&IStack_78,(BTreeImpl *)&(local_48->key).super_StringPtr.content.size_,&local_50);
  uVar4 = (ulong)IStack_78.row;
  if (uVar4 == 0xe) {
    uVar4 = 0xe;
  }
  else {
    uVar1 = (IStack_78.leaf)->rows[uVar4].i;
    if (uVar1 != 0) {
      uVar6 = (ulong)(uVar1 - 1);
      lVar2 = *(long *)(local_60 + 8 + uVar6 * 0x18);
      if ((lVar2 == in_R9[1]) &&
         (iVar3 = bcmp(*(void **)(local_60 + uVar6 * 0x18),(void *)*in_R9,lVar2 - 1), iVar3 == 0)) {
        *this = (TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>)0x1;
        *(ulong *)(this + 8) = uVar6;
        aVar5 = extraout_RDX;
        goto LAB_00165089;
      }
    }
  }
  memmove((IStack_78.leaf)->rows + uVar4 + 1,(IStack_78.leaf)->rows + uVar4,
          (ulong)(IStack_78.row + 1) * -4 + 0x38);
  ((IStack_78.leaf)->rows + uVar4 + 1)[-1] = (MaybeUint)((int)params + 1);
  *this = (TreeIndex<kj::TreeMap<capnp::Text::Reader,unsigned_int>::Callbacks>)0x0;
  aVar5 = extraout_RDX_00;
LAB_00165089:
  MVar7.ptr.field_1.value = aVar5.value;
  MVar7.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar7.ptr;
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    auto iter = impl.insert(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return *iter;
    } else {
      iter.insert(impl, pos);
      return nullptr;
    }
  }